

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  undefined2 *puVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  undefined4 in_register_0000003c;
  ulong uVar11;
  ulong uVar12;
  char *__s;
  char format [7];
  char *in_stack_ffffffffffffff88;
  char *message;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 uVar13;
  undefined6 in_stack_ffffffffffffff92;
  char local_5f;
  undefined1 local_5e [2];
  undefined1 auStack_5c [4];
  long local_58;
  longdouble local_4c;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_0000003c,precision);
  local_4c = value;
  if (buf->capacity_ <= buf->size_) {
    assert_fail((char *)CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),0,
                in_stack_ffffffffffffff88);
  }
  local_38 = (ulong)specs >> 0x20;
  uVar5 = 5;
  if (-1 < precision) {
    uVar5 = precision - 1;
  }
  bVar8 = specs._4_1_;
  uVar11 = (ulong)uVar5;
  if (1 < bVar8) {
    uVar11 = (ulong)(uint)precision;
  }
  local_5f = '%';
  if (bVar8 == 3 && (specs._4_4_ >> 0x14 & 1) != 0) {
    puVar6 = (undefined2 *)(local_5e + 1);
    local_5e[0] = 0x23;
  }
  else {
    puVar6 = (undefined2 *)local_5e;
  }
  if (-1 < (int)uVar11) {
    *puVar6 = 0x2a2e;
    puVar6 = puVar6 + 1;
  }
  *(undefined1 *)puVar6 = 0x4c;
  if (bVar8 == 3) {
    bVar8 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar8 = (bVar8 == 2) + 0x65;
  }
  *(byte *)((long)puVar6 + 1) = bVar8;
  *(undefined1 *)(puVar6 + 1) = 0;
  sVar3 = buf->size_;
  local_58 = sVar3 + 1;
LAB_001824e5:
  while( true ) {
    __s = buf->ptr_ + sVar3;
    uVar9 = buf->capacity_ - sVar3;
    uVar13 = (undefined2)((unkuint10)local_4c >> 0x40);
    message = SUB108(local_4c,0);
    if ((int)uVar11 < 0) {
      uVar5 = snprintf(__s,uVar9,&local_5f);
    }
    else {
      uVar5 = snprintf(__s,uVar9,&local_5f,uVar11);
    }
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 0) goto LAB_00182555;
    if (uVar12 < uVar9) break;
    uVar12 = local_58 + uVar12;
    if (buf->capacity_ < uVar12) goto LAB_00182562;
  }
  if ((char)local_38 == '\x02') {
    if ((int)local_40 != 0) {
      uVar11 = 1;
      do {
        lVar7 = uVar11 + (uVar12 - 2);
        uVar11 = uVar11 - 1;
      } while ((byte)(__s[lVar7] - 0x30U) < 10);
      if (0 < (int)uVar11) {
LAB_00182728:
        assert_fail((char *)CONCAT62(in_stack_ffffffffffffff92,uVar13),0,message);
      }
      memmove(__s + uVar11 + uVar12 + -1,__s + uVar11 + uVar12,(ulong)(-(int)uVar11 & 0x7fffffff));
      uVar9 = (ulong)(uVar5 - 1);
      if (buf->capacity_ < uVar9) {
        (**buf->_vptr_buffer)(buf,uVar9);
      }
      buf->size_ = uVar9;
      goto LAB_001826df;
    }
    if (buf->capacity_ < uVar12) {
      (**buf->_vptr_buffer)(buf,uVar12);
    }
    buf->size_ = uVar12;
  }
  else {
    if (((uint)local_38 & 0xff) != 3) {
      lVar7 = -2;
      uVar11 = uVar12 - 1;
      do {
        uVar9 = uVar11;
        lVar7 = lVar7 + 1;
        uVar11 = uVar9 - 1;
      } while (__s[uVar9] != 'e');
      cVar2 = __s[uVar9 + 1];
      if ((cVar2 != '+') && (cVar2 != '-')) {
        __assert_fail("sign == \'+\' || sign == \'-\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/fmt/include/fmt/format-inl.h"
                      ,0x4b3,
                      "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                     );
      }
      lVar7 = -lVar7;
      iVar10 = 0;
      do {
        if (9 < (byte)(__s[lVar7 + uVar12] - 0x30U)) {
          __assert_fail("is_digit(*p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/fmt/include/fmt/format-inl.h"
                        ,0x4b7,
                        "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                       );
        }
        iVar10 = (uint)(byte)__s[lVar7 + uVar12] + iVar10 * 10 + -0x30;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
      iVar4 = -iVar10;
      if (cVar2 != '-') {
        iVar4 = iVar10;
      }
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        do {
          pcVar1 = __s + uVar11;
          uVar11 = uVar11 - 1;
        } while (*pcVar1 == '0');
        if ((int)(uint)uVar11 < 0) goto LAB_00182728;
        memmove(__s + 1,__s + 2,(ulong)((uint)uVar11 & 0x7fffffff));
      }
      uVar9 = local_58 + (uVar11 & 0xffffffff);
      if (buf->capacity_ < uVar9) {
        (**buf->_vptr_buffer)(buf,uVar9);
      }
      buf->size_ = uVar9;
      uVar11 = (ulong)(uint)(iVar4 - (int)uVar11);
      goto LAB_001826df;
    }
    uVar12 = sVar3 + uVar12;
    if (buf->capacity_ < uVar12) {
      (**buf->_vptr_buffer)(buf,uVar12);
    }
    buf->size_ = uVar12;
  }
  uVar11 = 0;
LAB_001826df:
  return (int)uVar11;
LAB_00182555:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar12 = buf->capacity_ + 1;
LAB_00182562:
    (**buf->_vptr_buffer)(buf,uVar12);
  }
  goto LAB_001824e5;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto becase of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}